

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.hpp
# Opt level: O0

intrusive_ptr<const_boost::xpressive::detail::traits<char>_> * __thiscall
boost::intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator=
          (intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *this,
          intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *rhs)

{
  intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *in_RSI;
  intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *in_RDI;
  intrusive_ptr<const_boost::xpressive::detail::traits<char>_> in_stack_ffffffffffffffe8;
  
  intrusive_ptr(in_RSI,(intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                       in_stack_ffffffffffffffe8.px);
  swap((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)&stack0xffffffffffffffe8,
       in_RDI);
  ~intrusive_ptr(in_RSI);
  return in_RDI;
}

Assistant:

intrusive_ptr & operator=(intrusive_ptr const & rhs)
    {
        this_type(rhs).swap(*this);
        return *this;
    }